

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall pybind11::gil_scoped_acquire::gil_scoped_acquire(gil_scoped_acquire *this)

{
  int *piVar1;
  internals *piVar2;
  PyThreadState *pPVar3;
  
  this->tstate = (PyThreadState *)0x0;
  this->release = true;
  this->active = true;
  piVar2 = detail::get_internals();
  pPVar3 = (PyThreadState *)PyThread_tss_get(piVar2->tstate);
  this->tstate = pPVar3;
  if (pPVar3 == (PyThreadState *)0x0) {
    pPVar3 = (PyThreadState *)PyGILState_GetThisThreadState();
    this->tstate = pPVar3;
  }
  if (this->tstate == (PyThreadState *)0x0) {
    pPVar3 = (PyThreadState *)PyThreadState_New(piVar2->istate);
    this->tstate = pPVar3;
    pPVar3->gilstate_counter = 0;
    PyThread_tss_set(piVar2->tstate,pPVar3);
  }
  else {
    pPVar3 = (PyThreadState *)_PyThreadState_UncheckedGet();
    this->release = pPVar3 != this->tstate;
  }
  if (this->release == true) {
    PyEval_AcquireThread(this->tstate);
  }
  piVar1 = &this->tstate->gilstate_counter;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

PYBIND11_NOINLINE gil_scoped_acquire() {
        auto const &internals = detail::get_internals();
        tstate = (PyThreadState *) PYBIND11_TLS_GET_VALUE(internals.tstate);

        if (!tstate) {
            /* Check if the GIL was acquired using the PyGILState_* API instead (e.g. if
               calling from a Python thread). Since we use a different key, this ensures
               we don't create a new thread state and deadlock in PyEval_AcquireThread
               below. Note we don't save this state with internals.tstate, since we don't
               create it we would fail to clear it (its reference count should be > 0). */
            tstate = PyGILState_GetThisThreadState();
        }

        if (!tstate) {
            tstate = PyThreadState_New(internals.istate);
            #if !defined(NDEBUG)
                if (!tstate)
                    pybind11_fail("scoped_acquire: could not create thread state!");
            #endif
            tstate->gilstate_counter = 0;
            PYBIND11_TLS_REPLACE_VALUE(internals.tstate, tstate);
        } else {
            release = detail::get_thread_state_unchecked() != tstate;
        }

        if (release) {
            PyEval_AcquireThread(tstate);
        }

        inc_ref();
    }